

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this)

{
  int v1;
  undefined8 *puVar1;
  void **ppvVar2;
  string *psVar3;
  long lVar4;
  LogMessageFatal aLStack_28 [16];
  
  v1 = this->current_size_;
  ppvVar2 = elements(this);
  psVar3 = absl::lts_20240722::log_internal::Check_GTImpl_abi_cxx11_(v1,0,"n > 0");
  if (psVar3 == (string *)0x0) {
    lVar4 = 0;
    do {
      puVar1 = (undefined8 *)ppvVar2[lVar4];
      puVar1[1] = 0;
      lVar4 = lVar4 + 1;
      *(undefined1 *)*puVar1 = 0;
    } while (lVar4 < v1);
    this->current_size_ = 0;
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
             ,0x2a8,psVar3->_M_string_length,(psVar3->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_28);
}

Assistant:

PROTOBUF_NOINLINE void ClearNonEmpty() {
    const int n = current_size_;
    void* const* elems = elements();
    int i = 0;
    ABSL_DCHECK_GT(n, 0);
    // do/while loop to avoid initial test because we know n > 0
    do {
      TypeHandler::Clear(cast<TypeHandler>(elems[i++]));
    } while (i < n);
    ExchangeCurrentSize(0);
  }